

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

int read_int_group(uint8_t *in,uint32_t *out,int *ints_read)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  uint uVar7;
  uint uVar8;
  __m128i *palVar9;
  undefined4 *in_RDX;
  undefined1 in_SIL;
  undefined1 in_register_00000031;
  undefined6 in_register_00000032;
  undefined1 in_DIL;
  undefined1 in_register_00000039;
  undefined6 in_register_0000003a;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i data_bits;
  __m128i result_2;
  __m128i low_middle;
  __m128i high_bytes_shifted_1;
  __m128i middle_bytes_shifted;
  __m128i high_bytes_1;
  __m128i middle_bytes;
  __m128i low_bytes_1;
  __m128i bytes_to_decode_2;
  __m128i unpacked_result_b;
  __m128i unpacked_result_a;
  __m128i packed_result;
  __m128i high_bytes_shifted;
  __m128i high_bytes;
  __m128i low_bytes;
  __m128i bytes_to_decode_1;
  int consumed;
  __m128i shuffle_vector;
  int index;
  index_bytes_consumed combined;
  int mask2;
  __m128i result_1;
  int mask;
  __m128i *mout;
  __m128i initial;
  undefined8 local_7a8;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_6a8;
  undefined8 local_698;
  undefined8 uStack_690;
  byte local_60e;
  byte bStack_60d;
  undefined8 local_608;
  undefined8 uStack_600;
  uint local_5bc;
  uint uStack_78;
  __m128i result;
  __m128i result_evens;
  __m128i low_byte;
  __m128i recombined;
  __m128i shifted_split_bytes;
  __m128i split_bytes;
  __m128i bytes_to_decode;
  
  puVar3 = (undefined8 *)CONCAT62(in_register_00000032,CONCAT11(in_register_00000031,in_SIL));
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])
                       CONCAT62(in_register_0000003a,CONCAT11(in_register_00000039,in_DIL)));
  uVar7 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
  if (uVar7 == 0) {
    low_byte[1]._0_4_ = auVar1._0_4_;
    auVar11 = vpmovsxbd_avx(ZEXT416((uint)low_byte[1]));
    auVar10 = vpsrldq_avx(auVar1,4);
    local_608 = auVar11._0_8_;
    uStack_600 = auVar11._8_8_;
    *puVar3 = local_608;
    puVar3[1] = uStack_600;
    result_evens[1]._0_4_ = auVar10._0_4_;
    auVar1 = vpmovsxbd_avx(ZEXT416((uint)result_evens[1]));
    auVar11 = vpsrldq_avx(auVar10,4);
    local_608 = auVar1._0_8_;
    uStack_600 = auVar1._8_8_;
    puVar3[2] = local_608;
    puVar3[3] = uStack_600;
    result[1]._0_4_ = auVar11._0_4_;
    auVar1 = vpmovsxbd_avx(ZEXT416((uint)result[1]));
    auVar11 = vpsrldq_avx(auVar11,4);
    local_608 = auVar1._0_8_;
    uStack_600 = auVar1._8_8_;
    puVar3[4] = local_608;
    puVar3[5] = uStack_600;
    uStack_78 = auVar11._0_4_;
    auVar1 = vpmovsxbd_avx(ZEXT416(uStack_78));
    local_608 = auVar1._0_8_;
    uStack_600 = auVar1._8_8_;
    puVar3[6] = local_608;
    puVar3[7] = uStack_600;
    *in_RDX = 0x10;
    local_5bc = 0x10;
  }
  else {
    local_60e = combined_lookup[(int)(uVar7 & 0xfff)].index;
    uVar8 = (uint)local_60e;
    palVar9 = vectors_sse3 + (int)uVar8;
    alVar6 = *palVar9;
    alVar5 = *palVar9;
    alVar4 = *palVar9;
    bStack_60d = combined_lookup[(int)(uVar7 & 0xfff)].bytes_consumed;
    local_5bc = (uint)bStack_60d;
    if (uVar8 < 0x40) {
      *in_RDX = 6;
      auVar10 = vpshufb_avx(auVar1,(undefined1  [16])alVar4);
      auVar1 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
      auVar1 = vpinsrw_avx(auVar1,0x7f,2);
      auVar1 = vpinsrw_avx(auVar1,0x7f,3);
      auVar1 = vpinsrw_avx(auVar1,0x7f,4);
      auVar1 = vpinsrw_avx(auVar1,0x7f,5);
      auVar1 = vpinsrw_avx(auVar1,0x7f,6);
      auVar1 = vpinsrw_avx(auVar1,0x7f,7);
      auVar1 = vpand_avx(auVar10,auVar1);
      auVar11 = vpinsrw_avx(ZEXT216(0x7f00),0x7f00,1);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,2);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,3);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,4);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,5);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,6);
      auVar11 = vpinsrw_avx(auVar11,0x7f00,7);
      auVar11 = vpand_avx(auVar10,auVar11);
      auVar11 = vpsrlw_avx(auVar11,ZEXT416(1));
      auVar11 = vpor_avx(auVar1,auVar11);
      auVar1 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
      auVar1 = vpinsrd_avx(auVar1,0xffff,2);
      auVar1 = vpinsrd_avx(auVar1,0xffff,3);
      auVar1 = vpand_avx(auVar11,auVar1);
      local_698 = auVar1._0_8_;
      uStack_690 = auVar1._8_8_;
      *puVar3 = local_698;
      puVar3[1] = uStack_690;
      auVar1 = vpsrld_avx(auVar11,ZEXT416(0x10));
      local_6a8 = auVar1._0_8_;
      puVar3[2] = local_6a8;
    }
    else if (uVar8 < 0x91) {
      *in_RDX = 4;
      auVar2 = vpshufb_avx(auVar1,(undefined1  [16])alVar5);
      auVar1 = vpinsrd_avx(ZEXT416(0x7f),0x7f,1);
      auVar1 = vpinsrd_avx(auVar1,0x7f,2);
      auVar1 = vpinsrd_avx(auVar1,0x7f,3);
      auVar1 = vpand_avx(auVar2,auVar1);
      auVar11 = vpinsrd_avx(ZEXT416(0x7f00),0x7f00,1);
      auVar11 = vpinsrd_avx(auVar11,0x7f00,2);
      auVar11 = vpinsrd_avx(auVar11,0x7f00,3);
      auVar11 = vpand_avx(auVar2,auVar11);
      auVar10 = vpinsrd_avx(ZEXT416(0x7f0000),0x7f0000,1);
      auVar10 = vpinsrd_avx(auVar10,0x7f0000,2);
      auVar10 = vpinsrd_avx(auVar10,0x7f0000,3);
      auVar10 = vpand_avx(auVar2,auVar10);
      auVar11 = vpsrld_avx(auVar11,ZEXT416(1));
      auVar10 = vpsrld_avx(auVar10,ZEXT416(2));
      auVar1 = vpor_avx(auVar1,auVar11);
      auVar1 = vpor_avx(auVar1,auVar10);
      local_728 = auVar1._0_8_;
      uStack_720 = auVar1._8_8_;
      *puVar3 = local_728;
      puVar3[1] = uStack_720;
    }
    else {
      *in_RDX = 2;
      auVar11 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
      auVar11 = vpinsrb_avx(auVar11,0x7f,2);
      auVar11 = vpinsrb_avx(auVar11,0x7f,3);
      auVar11 = vpinsrb_avx(auVar11,0x7f,4);
      auVar11 = vpinsrb_avx(auVar11,0x7f,5);
      auVar11 = vpinsrb_avx(auVar11,0x7f,6);
      auVar11 = vpinsrb_avx(auVar11,0x7f,7);
      auVar11 = vpinsrb_avx(auVar11,0x7f,8);
      auVar11 = vpinsrb_avx(auVar11,0x7f,9);
      auVar11 = vpinsrb_avx(auVar11,0x7f,10);
      auVar11 = vpinsrb_avx(auVar11,0x7f,0xb);
      auVar11 = vpinsrb_avx(auVar11,0x7f,0xc);
      auVar11 = vpinsrb_avx(auVar11,0x7f,0xd);
      auVar11 = vpinsrb_avx(auVar11,0x7f,0xe);
      auVar11 = vpinsrb_avx(auVar11,0x7f,0xf);
      auVar1 = vpand_avx(auVar1,auVar11);
      auVar11 = vpshufb_avx(auVar1,(undefined1  [16])alVar6);
      auVar1 = vpinsrw_avx(ZEXT216(0x80),0x40,1);
      auVar1 = vpinsrw_avx(auVar1,0x20,2);
      auVar1 = vpinsrw_avx(auVar1,0x10,3);
      auVar1 = vpinsrw_avx(auVar1,0x80,4);
      auVar1 = vpinsrw_avx(auVar1,0x40,5);
      auVar1 = vpinsrw_avx(auVar1,0x20,6);
      auVar1 = vpinsrw_avx(auVar1,0x10,7);
      auVar1 = vpmullw_avx(auVar11,auVar1);
      auVar10 = vpsllq_avx(auVar1,ZEXT416(8));
      auVar1 = vpor_avx(auVar1,auVar10);
      auVar11 = vpsrlq_avx(auVar11,ZEXT416(0x38));
      auVar11 = vpor_avx(auVar1,auVar11);
      auVar1 = vpinsrb_avx(ZEXT116(0),2,1);
      auVar1 = vpinsrb_avx(auVar1,4,2);
      auVar1 = vpinsrb_avx(auVar1,6,3);
      auVar1 = vpinsrb_avx(auVar1,8,4);
      auVar1 = vpinsrb_avx(auVar1,10,5);
      auVar1 = vpinsrb_avx(auVar1,0xc,6);
      auVar1 = vpinsrb_avx(auVar1,0xe,7);
      auVar1 = vpinsrb_avx(auVar1,0xff,8);
      auVar1 = vpinsrb_avx(auVar1,0xff,9);
      auVar1 = vpinsrb_avx(auVar1,0xff,10);
      auVar1 = vpinsrb_avx(auVar1,0xff,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
      auVar1 = vpinsrb_avx(auVar1,0xff,0xf);
      auVar1 = vpshufb_avx(auVar11,auVar1);
      local_7a8 = auVar1._0_8_;
      *puVar3 = local_7a8;
    }
  }
  return local_5bc;
}

Assistant:

static int read_int_group(const uint8_t *in, uint32_t *out, int *ints_read) {

  __m128i initial = _mm_lddqu_si128((const __m128i *)in);
  __m128i *const mout = (__m128i *)out;

  int mask = _mm_movemask_epi8(initial);
  if (mask == 0) {
    __m128i result;
    result = _mm_cvtepi8_epi32(initial);
    initial = _mm_srli_si128(initial, 4);
    _mm_storeu_si128(mout, result);
    result = _mm_cvtepi8_epi32(initial);
    initial = _mm_srli_si128(initial, 4);
    _mm_storeu_si128(mout + 1, result);
    result = _mm_cvtepi8_epi32(initial);
    initial = _mm_srli_si128(initial, 4);
    _mm_storeu_si128(mout + 2, result);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 3, result);
    *ints_read = 16;
    return 16;
  }
  int mask2 = mask & 0xFFF;
  index_bytes_consumed combined = combined_lookup[mask2];

  int index = combined.index;

  __m128i shuffle_vector = vectors_sse3[index];
  int consumed = combined.bytes_consumed;

  if (index < 64) {
    *ints_read = 6;
    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x007F));
    __m128i high_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x7F00));
    __m128i high_bytes_shifted = _mm_srli_epi16(high_bytes, 1);
    __m128i packed_result = _mm_or_si128(low_bytes, high_bytes_shifted);
    __m128i unpacked_result_a =
        _mm_and_si128(packed_result, _mm_set1_epi32(0x0000FFFF));
    _mm_storeu_si128(mout, unpacked_result_a);
    __m128i unpacked_result_b = _mm_srli_epi32(packed_result, 16);
    _mm_storel_epi64(mout + 1, unpacked_result_b);
    return consumed;
  }
  if (index < 145) {

    *ints_read = 4;

    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x0000007F));
    __m128i middle_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x00007F00));
    __m128i high_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x007F0000));
    __m128i middle_bytes_shifted = _mm_srli_epi32(middle_bytes, 1);
    __m128i high_bytes_shifted = _mm_srli_epi32(high_bytes, 2);
    __m128i low_middle = _mm_or_si128(low_bytes, middle_bytes_shifted);
    __m128i result = _mm_or_si128(low_middle, high_bytes_shifted);
    _mm_storeu_si128(mout, result);
    return consumed;
  }

  *ints_read = 2;

  __m128i data_bits = _mm_and_si128(initial, _mm_set1_epi8(0x7F));
  __m128i bytes_to_decode = _mm_shuffle_epi8(data_bits, shuffle_vector);
  __m128i split_bytes = _mm_mullo_epi16(
      bytes_to_decode, _mm_setr_epi16(128, 64, 32, 16, 128, 64, 32, 16));
  __m128i shifted_split_bytes = _mm_slli_epi64(split_bytes, 8);
  __m128i recombined = _mm_or_si128(split_bytes, shifted_split_bytes);
  __m128i low_byte = _mm_srli_epi64(bytes_to_decode, 56);
  __m128i result_evens = _mm_or_si128(recombined, low_byte);
  __m128i result = _mm_shuffle_epi8(
      result_evens,
      _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, -1, -1, -1, -1, -1, -1, -1, -1));

  _mm_storel_epi64(mout, result);
  return consumed;
}